

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O3

void __thiscall xmrig::Worker::Worker(Worker *this,size_t id,int64_t affinity,int priority)

{
  uint32_t uVar1;
  
  (this->super_IWorker)._vptr_IWorker = (_func_int **)&PTR__IWorker_001acd58;
  this->m_affinity = affinity;
  this->m_id = id;
  this->m_count = 0;
  (this->m_hashCount).super___atomic_base<unsigned_long>._M_i = 0;
  (this->m_timestamp).super___atomic_base<unsigned_long>._M_i = 0;
  this->m_node = 0;
  uVar1 = VirtualMemory::bindToNUMANode(affinity);
  this->m_node = uVar1;
  if (-1 < affinity) {
    Platform::setThreadAffinity(affinity);
  }
  Platform::setThreadPriority(priority);
  return;
}

Assistant:

xmrig::Worker::Worker(size_t id, int64_t affinity, int priority) :
    m_affinity(affinity),
    m_id(id),
    m_hashCount(0),
    m_timestamp(0)
{
    m_node = VirtualMemory::bindToNUMANode(affinity);

    Platform::trySetThreadAffinity(affinity);
    Platform::setThreadPriority(priority);
}